

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* __thiscall
mocker::detail::InterferenceGraph::getCurAdjList
          (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           *__return_storage_ptr__,InterferenceGraph *this,Node *node)

{
  bool bVar1;
  mapped_type *this_00;
  reference x;
  value_type *n;
  const_iterator __end2;
  const_iterator __begin2;
  mapped_type *__range2;
  Node *node_local;
  InterferenceGraph *this_local;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *res;
  
  std::
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  ::vector(__return_storage_ptr__);
  this_00 = std::
            unordered_map<std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
            ::at(&this->originalAdjList,node);
  __end2 = std::
           unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::begin(this_00);
  n = (value_type *)
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::end(this_00);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>
                            ,(_Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true> *)
                             &n), bVar1) {
    x = std::__detail::_Node_const_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>::
        operator*(&__end2);
    bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                      (&this->removed,x);
    if ((!bVar1) &&
       (bVar1 = isIn<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::shared_ptr<mocker::nasm::Register>>
                          (&this->coalesced,x), !bVar1)) {
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
      ::emplace_back<std::shared_ptr<mocker::nasm::Register>const&>
                ((vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
                  *)__return_storage_ptr__,x);
    }
    std::__detail::_Node_const_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>::
    operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node> InterferenceGraph::getCurAdjList(const Node &node) const {
  std::vector<Node> res;
  for (auto &n : originalAdjList.at(node)) {
    if (!isIn(removed, n) && !isIn(coalesced, n))
      res.emplace_back(n);
  }
  return res;
}